

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue SVar2;
  SQObjectPtr *obj;
  long lVar3;
  bool bVar4;
  SQObjectPtr local_30;
  
  SVar2.pNativeClosure = SQNativeClosure::Create(v->_sharedstate,func,nfreevars);
  ((SVar2.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
  lVar3 = 0;
  while (bVar4 = nfreevars != 0, nfreevars = nfreevars - 1, bVar4) {
    obj = SQVM::Top(v);
    SQObjectPtr::operator=
              ((SQObjectPtr *)
               ((long)&((SVar2.pClosure)->_outervalues->super_SQObject)._type + lVar3),obj);
    SQVM::Pop(v);
    lVar3 = lVar3 + 0x10;
  }
  local_30.super_SQObject._type = OT_NATIVECLOSURE;
  pSVar1 = &((SVar2.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_30.super_SQObject._unVal.pNativeClosure = SVar2.pNativeClosure;
  SQVM::Push(v,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return;
}

Assistant:

void sq_newclosure(HSQUIRRELVM v,SQFUNCTION func,SQUnsignedInteger nfreevars)
{
    SQNativeClosure *nc = SQNativeClosure::Create(_ss(v), func,nfreevars);
    nc->_nparamscheck = 0;
    for(SQUnsignedInteger i = 0; i < nfreevars; i++) {
        nc->_outervalues[i] = v->Top();
        v->Pop();
    }
    v->Push(SQObjectPtr(nc));
}